

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_tried_collisions::test_method(addrman_tried_collisions *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  CService ipIn_02;
  CService ipIn_03;
  CService ipIn_04;
  __single_object _Var2;
  readonly_property<bool> rVar3;
  bool bVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  CService *pCVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l;
  const_string file_01;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  initializer_list<CAddress> __l_01;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  undefined4 uVar9;
  undefined4 uVar10;
  uint32_t *puVar11;
  char *pcVar12;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  allocator_type local_341;
  vector<CAddress,_std::allocator<CAddress>_> local_340;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  assertion_result local_268;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  uint32_t num_addrs;
  __single_object addrman;
  CService local_1f0;
  CService local_1c8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_190;
  CService addr2;
  CService local_158;
  CService local_130;
  CService local_108;
  CService local_e0;
  undefined1 local_b8 [56];
  CService addr1;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._0_4_ = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"252.2.2.2",(allocator<char> *)&addr1);
  ResolveIP(&source,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  num_addrs = 0;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x160;
  file.m_begin = (iterator)&local_210;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_220,msg);
  local_b8[8] = '\0';
  local_b8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_228 = "";
  addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar8 = &addr1;
  pcVar12 = "num_addrs";
  puVar11 = &num_addrs;
  uVar9 = 0xb64cd2;
  uVar10 = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_b8,&local_230,0x160,1);
  while( true ) {
    if (0x22 < num_addrs) break;
    num_addrs = num_addrs + 1;
    util::ToString<unsigned_int>((string *)&addr2,&num_addrs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   "250.1.1.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
    ResolveService(&addr1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8,0);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)&addr2);
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_238 = "";
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x164;
    file_00.m_begin = (iterator)&local_240;
    msg_00.m_end = (iterator)pCVar8;
    msg_00.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_250,
               msg_00);
    _Var2 = addrman;
    CService::CService(&local_e0,&addr1);
    ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar10;
    ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar9;
    ipIn.super_CNetAddr.m_addr._union._8_8_ = puVar11;
    ipIn.super_CNetAddr.m_addr._16_8_ = pcVar12;
    ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc60;
    ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
    ipIn._32_8_ = in_stack_fffffffffffffc68;
    CAddress::CAddress((CAddress *)local_b8,ipIn,(ServiceFlags)&local_e0);
    __l._M_len = 1;
    __l._M_array = (CAddress *)local_b8;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_268,__l,
               (allocator_type *)&local_358);
    rVar3.super_class_property<bool>.value =
         (class_property<bool>)
         AddrMan::Add((AddrMan *)
                      _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                      super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                      super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                      (vector<CAddress,_std::allocator<CAddress>_> *)&local_268,&source,(seconds)0x0
                     );
    local_1a0._8_8_ = (element_type *)0x0;
    aStack_190._M_allocated_capacity = 0;
    local_340.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xb65669;
    local_340.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb6569a;
    addr2.super_CNetAddr.m_addr._union.direct[8] = '\0';
    addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)&PTR__lazy_ostream_011481f0;
    addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    addr2.super_CNetAddr._24_8_ = &local_340;
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_270 = "";
    uVar9 = 0;
    uVar10 = 0;
    pvVar6 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    local_1a0[0] = rVar3.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1a0,(lazy_ostream *)&addr2,1,0,WARN,(check_type)puVar11,
               (size_t)&local_278,0x164);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_268);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e0);
    local_288 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_280 = "";
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x167;
    file_01.m_begin = (iterator)&local_288;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_298,
               msg_01);
    _Var2 = addrman;
    CService::CService(&local_108,&addr1);
    ipIn_00.super_CNetAddr.m_addr._union._4_4_ = uVar10;
    ipIn_00.super_CNetAddr.m_addr._union._0_4_ = uVar9;
    ipIn_00.super_CNetAddr.m_addr._union._8_8_ = puVar11;
    ipIn_00.super_CNetAddr.m_addr._16_8_ = pcVar12;
    ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc60;
    ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
    ipIn_00._32_8_ = in_stack_fffffffffffffc68;
    CAddress::CAddress((CAddress *)local_b8,ipIn_00,(ServiceFlags)&local_108);
    tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    local_1a0[0] = (class_property<bool>)
                   AddrMan::Good((AddrMan *)
                                 _Var2._M_t.
                                 super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                 (CService *)local_b8,(NodeSeconds)tVar5.__d.__r);
    local_1a0._8_8_ = (element_type *)0x0;
    aStack_190._M_allocated_capacity = 0;
    local_268._0_8_ = "addrman->Good(CAddress(addr, NODE_NONE))";
    local_268.m_message.px = (element_type *)0xb65748;
    addr2.super_CNetAddr.m_addr._union.direct[8] = '\0';
    addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)&PTR__lazy_ostream_011481f0;
    addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_2a0 = "";
    uVar9 = 0;
    uVar10 = 0;
    pvVar6 = &DAT_00000001;
    pCVar8 = (CService *)0x0;
    addr2.super_CNetAddr._24_8_ = &local_268;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1a0,(lazy_ostream *)&addr2,1,0,WARN,(check_type)puVar11,
               (size_t)&local_2a8,0x167);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  }
  num_addrs = num_addrs + 1;
  util::ToString<unsigned_int>((string *)&addr2,&num_addrs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 "250.1.1.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  ResolveService(&addr1,(string *)local_b8,0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&addr2);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x16d;
  file_02.m_begin = (iterator)&local_2b8;
  msg_02.m_end = (iterator)pCVar8;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2c8,
             msg_02);
  _Var2 = addrman;
  CService::CService(&local_130,&addr1);
  ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = puVar11;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc60;
  ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  ipIn_01._32_8_ = in_stack_fffffffffffffc68;
  CAddress::CAddress((CAddress *)local_b8,ipIn_01,(ServiceFlags)&local_130);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_b8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_268,__l_00,
             (allocator_type *)&local_358);
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)&local_268,&source,(seconds)0x0);
  local_1a0._8_8_ = (element_type *)0x0;
  aStack_190._M_allocated_capacity = 0;
  local_340.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb64d10;
  local_340.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb64d42;
  addr2.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011481f0;
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CNetAddr._24_8_ = &local_340;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2d0 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_1a0[0] = rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a0,(lazy_ostream *)&addr2,1,0,WARN,(check_type)puVar11,
             (size_t)&local_2d8,0x16d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_268);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_130);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x16e;
  file_03.m_begin = (iterator)&local_2e8;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f8,
             msg_03);
  _Var2 = addrman;
  CService::CService(&local_158,&addr1);
  ipIn_02.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn_02.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn_02.super_CNetAddr.m_addr._union._8_8_ = puVar11;
  ipIn_02.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_02.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc60;
  ipIn_02.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  ipIn_02._32_8_ = in_stack_fffffffffffffc68;
  CAddress::CAddress((CAddress *)local_b8,ipIn_02,(ServiceFlags)&local_158);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  bVar4 = AddrMan::Good((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)local_b8,
                        (NodeSeconds)tVar5.__d.__r);
  local_1a0[0] = (class_property<bool>)(class_property<bool>)!bVar4;
  local_1a0._8_8_ = (element_type *)0x0;
  aStack_190._M_allocated_capacity = 0;
  local_268._0_8_ = "!addrman->Good(CAddress(addr1, NODE_NONE))";
  local_268.m_message.px = (element_type *)0xb65773;
  addr2.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011481f0;
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_300 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  addr2.super_CNetAddr._24_8_ = (vector<CAddress,_std::allocator<CAddress>_> *)&local_268;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a0,(lazy_ostream *)&addr2,1,0,WARN,(check_type)puVar11,
             (size_t)&local_308,0x16e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_158);
  num_addrs = num_addrs + 1;
  util::ToString<unsigned_int>((string *)local_1a0,&num_addrs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 "250.1.1.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
  ResolveService(&addr2,(string *)local_b8,0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_1a0);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x172;
  file_04.m_begin = (iterator)&local_318;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_328,
             msg_04);
  _Var2 = addrman;
  CService::CService(&local_1c8,&addr2);
  ipIn_03.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn_03.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn_03.super_CNetAddr.m_addr._union._8_8_ = puVar11;
  ipIn_03.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_03.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc60;
  ipIn_03.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  ipIn_03._32_8_ = in_stack_fffffffffffffc68;
  CAddress::CAddress((CAddress *)local_b8,ipIn_03,(ServiceFlags)&local_1c8);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_b8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&local_340,__l_01,&local_341);
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_340,&source,
                    (seconds)0x0);
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = "addrman->Add({CAddress(addr2, NODE_NONE)}, source)";
  local_350 = "";
  local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
  local_1a0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_190._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_360 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  aStack_190._8_8_ = (allocator_type *)&local_358;
  local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)local_1a0,1,0,WARN,(check_type)puVar11,(size_t)&local_368,
             0x172);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_340);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x173;
  file_05.m_begin = (iterator)&local_378;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_388,
             msg_05);
  CService::CService(&local_1f0,&addr2);
  ipIn_04.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn_04.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn_04.super_CNetAddr.m_addr._union._8_8_ = puVar11;
  ipIn_04.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_04.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc60;
  ipIn_04.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  ipIn_04._32_8_ = in_stack_fffffffffffffc68;
  CAddress::CAddress((CAddress *)local_b8,ipIn_04,(ServiceFlags)&local_1f0);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Good((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)local_b8,
                     (NodeSeconds)tVar5.__d.__r);
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb65774;
  local_340.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb6579d;
  local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
  local_1a0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_190._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_190._8_8_ = &local_340;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)local_1a0,1,0,WARN,(check_type)puVar11,
             (size_t)&stack0xfffffffffffffc68,0x173);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_tried_collisions)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    uint32_t num_addrs{0};

    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs);

    while (num_addrs < 35) { // Magic number! 250.1.1.1 - 250.1.1.35 do not collide in tried with deterministic key = 1
        CService addr = ResolveService("250.1.1." + ToString(++num_addrs));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));

        // Test: Add to tried without collision
        BOOST_CHECK(addrman->Good(CAddress(addr, NODE_NONE)));

    }

    // Test: Unable to add to tried table due to collision!
    CService addr1 = ResolveService("250.1.1." + ToString(++num_addrs));
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK(!addrman->Good(CAddress(addr1, NODE_NONE)));

    // Test: Add the next address to tried without collision
    CService addr2 = ResolveService("250.1.1." + ToString(++num_addrs));
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK(addrman->Good(CAddress(addr2, NODE_NONE)));
}